

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::StructuredAssignmentPatternSyntax::setChild
          (StructuredAssignmentPatternSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *this_00;
  SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax> *pSVar1;
  logic_error *this_01;
  Token TVar2;
  string local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  StructuredAssignmentPatternSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  if (index == 0) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar2._0_8_;
    (this->openBrace).kind = (undefined2)local_28;
    (this->openBrace).field_0x2 = local_28._2_1_;
    (this->openBrace).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->openBrace).rawLen = local_28._4_4_;
    local_20 = TVar2.info;
    (this->openBrace).info = local_20;
  }
  else if (index == 1) {
    this_00 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::
             as<slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>>
                       (this_00);
    SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::operator=(&this->items,pSVar1);
  }
  else {
    if (index != 2) {
      this_01 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
                 ,&local_d9);
      std::operator+(&local_b8,&local_d8,":");
      std::__cxx11::to_string(&local_110,0x30da);
      std::operator+(&local_98,&local_b8,&local_110);
      std::operator+(&local_78,&local_98,": ");
      std::operator+(&local_58,&local_78,"Default case should be unreachable!");
      std::logic_error::logic_error(this_01,(string *)&local_58);
      __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar2._0_8_;
    (this->closeBrace).kind = (undefined2)local_38;
    (this->closeBrace).field_0x2 = local_38._2_1_;
    (this->closeBrace).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->closeBrace).rawLen = local_38._4_4_;
    local_30 = TVar2.info;
    (this->closeBrace).info = local_30;
  }
  return;
}

Assistant:

void StructuredAssignmentPatternSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openBrace = child.token(); return;
        case 1: items = child.node()->as<SeparatedSyntaxList<AssignmentPatternItemSyntax>>(); return;
        case 2: closeBrace = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}